

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int GetVersionSeanet(SEANET *pSeanet)

{
  int iVar1;
  char *__s;
  int local_3c;
  uchar reqbuf [14];
  uchar databuf [25];
  
  reqbuf[8] = '\x02';
  reqbuf[9] = '\x03';
  reqbuf[10] = '\x17';
  reqbuf[0xb] = 0x80;
  reqbuf[0xc] = '\x02';
  reqbuf[0xd] = '\n';
  builtin_memcpy(reqbuf,"@0008\b",7);
  reqbuf[7] = 0xff;
  iVar1 = WriteAllRS232Port(&pSeanet->RS232Port,reqbuf,0xe);
  if (iVar1 == 0) {
    databuf[0x10] = '\0';
    databuf[0x11] = '\0';
    databuf[0x12] = '\0';
    databuf[0x13] = '\0';
    databuf[0x14] = '\0';
    databuf[0x15] = '\0';
    databuf[0x16] = '\0';
    databuf[0x17] = '\0';
    databuf[0x18] = '\0';
    databuf[0] = '\0';
    databuf[1] = '\0';
    databuf[2] = '\0';
    databuf[3] = '\0';
    databuf[4] = '\0';
    databuf[5] = '\0';
    databuf[6] = '\0';
    databuf[7] = '\0';
    databuf[8] = '\0';
    databuf[9] = '\0';
    databuf[10] = '\0';
    databuf[0xb] = '\0';
    databuf[0xc] = '\0';
    databuf[0xd] = '\0';
    databuf[0xe] = '\0';
    databuf[0xf] = '\0';
    local_3c = 0;
    iVar1 = GetLatestMsgSeanet(pSeanet,1,databuf,0x19,&local_3c);
    if (iVar1 == 0) {
      return 0;
    }
    __s = "A Seanet is not responding correctly. ";
  }
  else {
    __s = "Error writing data to a Seanet. ";
  }
  puts(__s);
  return 1;
}

Assistant:

inline int GetVersionSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','8',0x08,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x03,mtSendVersion,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,MESSAGE_TERMINATOR_SEANET};
	unsigned char databuf[25];
	int nbdatabytes = 0;

	// Send mtSendVersion message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	// Wait for a mtVersionData message.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMsgSeanet(pSeanet, mtVersionData, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}